

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_strmode.c
# Opt level: O0

char * archive_entry_strmode(archive_entry_conflict *entry)

{
  mode_t mVar1;
  mode_t mVar2;
  wchar_t wVar3;
  char *__dest;
  char *pcVar4;
  archive_entry *in_RDI;
  wchar_t i;
  mode_t mode;
  char *bp;
  undefined4 in_stack_ffffffffffffffd8;
  wchar_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int local_18;
  
  __dest = in_RDI->strmode;
  strcpy(__dest,"?rwxrwxrwx ");
  mVar1 = archive_entry_mode(in_RDI);
  mVar2 = archive_entry_filetype(in_RDI);
  if (mVar2 == 0x1000) {
    *__dest = 'p';
  }
  else if (mVar2 == 0x2000) {
    *__dest = 'c';
  }
  else if (mVar2 == 0x4000) {
    *__dest = 'd';
  }
  else if (mVar2 == 0x6000) {
    *__dest = 'b';
  }
  else if (mVar2 == 0x8000) {
    *__dest = '-';
  }
  else if (mVar2 == 0xa000) {
    *__dest = 'l';
  }
  else if (mVar2 == 0xc000) {
    *__dest = 's';
  }
  else {
    pcVar4 = archive_entry_hardlink
                       ((archive_entry *)
                        CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (pcVar4 != (char *)0x0) {
      *__dest = 'h';
    }
  }
  for (local_18 = 0; local_18 < 9; local_18 = local_18 + 1) {
    if ((mVar1 & archive_entry_strmode::permbits[local_18]) == 0) {
      __dest[local_18 + 1] = '-';
    }
  }
  if ((mVar1 & 0x800) != 0) {
    if ((mVar1 & 0x40) == 0) {
      in_RDI->strmode[3] = 'S';
    }
    else {
      in_RDI->strmode[3] = 's';
    }
  }
  if ((mVar1 & 0x400) != 0) {
    if ((mVar1 & 8) == 0) {
      in_RDI->strmode[6] = 'S';
    }
    else {
      in_RDI->strmode[6] = 's';
    }
  }
  if ((mVar1 & 0x200) != 0) {
    if ((mVar1 & 1) == 0) {
      in_RDI->strmode[9] = 'T';
    }
    else {
      in_RDI->strmode[9] = 't';
    }
  }
  wVar3 = archive_entry_acl_count
                    ((archive_entry *)CONCAT44(mVar2,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
  if (wVar3 != L'\0') {
    in_RDI->strmode[10] = '+';
  }
  return __dest;
}

Assistant:

const char *
archive_entry_strmode(struct archive_entry *entry)
{
	static const mode_t permbits[] =
	    { 0400, 0200, 0100, 0040, 0020, 0010, 0004, 0002, 0001 };
	char *bp = entry->strmode;
	mode_t mode;
	int i;

	/* Fill in a default string, then selectively override. */
	strcpy(bp, "?rwxrwxrwx ");

	mode = archive_entry_mode(entry);
	switch (archive_entry_filetype(entry)) {
	case AE_IFREG:  bp[0] = '-'; break;
	case AE_IFBLK:  bp[0] = 'b'; break;
	case AE_IFCHR:  bp[0] = 'c'; break;
	case AE_IFDIR:  bp[0] = 'd'; break;
	case AE_IFLNK:  bp[0] = 'l'; break;
	case AE_IFSOCK: bp[0] = 's'; break;
	case AE_IFIFO:  bp[0] = 'p'; break;
	default:
		if (archive_entry_hardlink(entry) != NULL) {
			bp[0] = 'h';
			break;
		}
	}

	for (i = 0; i < 9; i++)
		if (!(mode & permbits[i]))
			bp[i+1] = '-';

	if (mode & S_ISUID) {
		if (mode & 0100) bp[3] = 's';
		else bp[3] = 'S';
	}
	if (mode & S_ISGID) {
		if (mode & 0010) bp[6] = 's';
		else bp[6] = 'S';
	}
	if (mode & S_ISVTX) {
		if (mode & 0001) bp[9] = 't';
		else bp[9] = 'T';
	}
	if (archive_entry_acl_count(entry, ARCHIVE_ENTRY_ACL_TYPE_ACCESS))
		bp[10] = '+';

	return (bp);
}